

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__vertical_gather_with_4_coeffs_cont
               (float *outputp,float *vertical_coefficients,float **inputs,float *input0_end)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float *pfVar86;
  float *pfVar87;
  long lVar88;
  float *output;
  float *pfVar89;
  float *pfVar90;
  long lVar91;
  
  pfVar86 = *inputs;
  pfVar89 = inputs[1];
  fVar7 = *vertical_coefficients;
  fVar8 = vertical_coefficients[1];
  pfVar90 = inputs[2];
  fVar9 = vertical_coefficients[2];
  pfVar87 = inputs[3];
  fVar10 = vertical_coefficients[3];
  lVar91 = (long)input0_end - (long)pfVar86;
  if (0x3f < lVar91) {
    lVar88 = 0;
    do {
      pfVar1 = (float *)((long)outputp + lVar88);
      fVar11 = pfVar1[1];
      fVar12 = pfVar1[2];
      fVar13 = pfVar1[3];
      pfVar2 = (float *)((long)outputp + lVar88 + 0x10);
      fVar14 = *pfVar2;
      fVar15 = pfVar2[1];
      fVar16 = pfVar2[2];
      fVar17 = pfVar2[3];
      pfVar2 = (float *)((long)outputp + lVar88 + 0x20);
      fVar18 = *pfVar2;
      fVar19 = pfVar2[1];
      fVar20 = pfVar2[2];
      fVar21 = pfVar2[3];
      pfVar2 = (float *)((long)outputp + lVar88 + 0x30);
      fVar22 = *pfVar2;
      fVar23 = pfVar2[1];
      fVar24 = pfVar2[2];
      fVar25 = pfVar2[3];
      pfVar2 = (float *)((long)pfVar86 + lVar88);
      fVar26 = pfVar2[1];
      fVar27 = pfVar2[2];
      fVar28 = pfVar2[3];
      pfVar3 = (float *)((long)pfVar86 + lVar88 + 0x10);
      fVar29 = *pfVar3;
      fVar30 = pfVar3[1];
      fVar31 = pfVar3[2];
      fVar32 = pfVar3[3];
      pfVar3 = (float *)((long)pfVar86 + lVar88 + 0x20);
      fVar33 = *pfVar3;
      fVar34 = pfVar3[1];
      fVar35 = pfVar3[2];
      fVar36 = pfVar3[3];
      pfVar3 = (float *)((long)pfVar86 + lVar88 + 0x30);
      fVar37 = *pfVar3;
      fVar38 = pfVar3[1];
      fVar39 = pfVar3[2];
      fVar40 = pfVar3[3];
      pfVar3 = (float *)((long)pfVar89 + lVar88);
      fVar41 = pfVar3[1];
      fVar42 = pfVar3[2];
      fVar43 = pfVar3[3];
      pfVar4 = (float *)((long)pfVar89 + lVar88 + 0x10);
      fVar44 = *pfVar4;
      fVar45 = pfVar4[1];
      fVar46 = pfVar4[2];
      fVar47 = pfVar4[3];
      pfVar4 = (float *)((long)pfVar89 + lVar88 + 0x20);
      fVar48 = *pfVar4;
      fVar49 = pfVar4[1];
      fVar50 = pfVar4[2];
      fVar51 = pfVar4[3];
      pfVar4 = (float *)((long)pfVar89 + lVar88 + 0x30);
      fVar52 = *pfVar4;
      fVar53 = pfVar4[1];
      fVar54 = pfVar4[2];
      fVar55 = pfVar4[3];
      pfVar4 = (float *)((long)pfVar90 + lVar88);
      fVar56 = pfVar4[1];
      fVar57 = pfVar4[2];
      fVar58 = pfVar4[3];
      pfVar5 = (float *)((long)pfVar90 + lVar88 + 0x10);
      fVar59 = *pfVar5;
      fVar60 = pfVar5[1];
      fVar61 = pfVar5[2];
      fVar62 = pfVar5[3];
      pfVar5 = (float *)((long)pfVar90 + lVar88 + 0x20);
      fVar63 = *pfVar5;
      fVar64 = pfVar5[1];
      fVar65 = pfVar5[2];
      fVar66 = pfVar5[3];
      pfVar5 = (float *)((long)pfVar90 + lVar88 + 0x30);
      fVar67 = *pfVar5;
      fVar68 = pfVar5[1];
      fVar69 = pfVar5[2];
      fVar70 = pfVar5[3];
      pfVar5 = (float *)((long)pfVar87 + lVar88);
      fVar71 = pfVar5[1];
      fVar72 = pfVar5[2];
      fVar73 = pfVar5[3];
      pfVar6 = (float *)((long)pfVar87 + lVar88 + 0x10);
      fVar74 = *pfVar6;
      fVar75 = pfVar6[1];
      fVar76 = pfVar6[2];
      fVar77 = pfVar6[3];
      pfVar6 = (float *)((long)pfVar87 + lVar88 + 0x20);
      fVar78 = *pfVar6;
      fVar79 = pfVar6[1];
      fVar80 = pfVar6[2];
      fVar81 = pfVar6[3];
      pfVar6 = (float *)((long)pfVar87 + lVar88 + 0x30);
      fVar82 = *pfVar6;
      fVar83 = pfVar6[1];
      fVar84 = pfVar6[2];
      fVar85 = pfVar6[3];
      pfVar6 = (float *)((long)outputp + lVar88);
      *pfVar6 = *pfVar5 * fVar10 + *pfVar4 * fVar9 + *pfVar3 * fVar8 + *pfVar2 * fVar7 + *pfVar1;
      pfVar6[1] = fVar71 * fVar10 + fVar56 * fVar9 + fVar41 * fVar8 + fVar26 * fVar7 + fVar11;
      pfVar6[2] = fVar72 * fVar10 + fVar57 * fVar9 + fVar42 * fVar8 + fVar27 * fVar7 + fVar12;
      pfVar6[3] = fVar73 * fVar10 + fVar58 * fVar9 + fVar43 * fVar8 + fVar28 * fVar7 + fVar13;
      pfVar1 = (float *)((long)outputp + lVar88 + 0x10);
      *pfVar1 = fVar74 * fVar10 + fVar59 * fVar9 + fVar44 * fVar8 + fVar29 * fVar7 + fVar14;
      pfVar1[1] = fVar75 * fVar10 + fVar60 * fVar9 + fVar45 * fVar8 + fVar30 * fVar7 + fVar15;
      pfVar1[2] = fVar76 * fVar10 + fVar61 * fVar9 + fVar46 * fVar8 + fVar31 * fVar7 + fVar16;
      pfVar1[3] = fVar77 * fVar10 + fVar62 * fVar9 + fVar47 * fVar8 + fVar32 * fVar7 + fVar17;
      pfVar1 = (float *)((long)outputp + lVar88 + 0x20);
      *pfVar1 = fVar78 * fVar10 + fVar63 * fVar9 + fVar48 * fVar8 + fVar33 * fVar7 + fVar18;
      pfVar1[1] = fVar79 * fVar10 + fVar64 * fVar9 + fVar49 * fVar8 + fVar34 * fVar7 + fVar19;
      pfVar1[2] = fVar80 * fVar10 + fVar65 * fVar9 + fVar50 * fVar8 + fVar35 * fVar7 + fVar20;
      pfVar1[3] = fVar81 * fVar10 + fVar66 * fVar9 + fVar51 * fVar8 + fVar36 * fVar7 + fVar21;
      pfVar1 = (float *)((long)outputp + lVar88 + 0x30);
      *pfVar1 = fVar82 * fVar10 + fVar67 * fVar9 + fVar52 * fVar8 + fVar37 * fVar7 + fVar22;
      pfVar1[1] = fVar83 * fVar10 + fVar68 * fVar9 + fVar53 * fVar8 + fVar38 * fVar7 + fVar23;
      pfVar1[2] = fVar84 * fVar10 + fVar69 * fVar9 + fVar54 * fVar8 + fVar39 * fVar7 + fVar24;
      pfVar1[3] = fVar85 * fVar10 + fVar70 * fVar9 + fVar55 * fVar8 + fVar40 * fVar7 + fVar25;
      lVar88 = lVar88 + 0x40;
      lVar91 = lVar91 + -0x40;
    } while (0x3f < lVar91);
    outputp = (float *)((long)outputp + lVar88);
    pfVar86 = (float *)((long)pfVar86 + lVar88);
    pfVar89 = (float *)((long)pfVar89 + lVar88);
    pfVar90 = (float *)((long)pfVar90 + lVar88);
    pfVar87 = (float *)((long)pfVar87 + lVar88);
  }
  for (lVar91 = (long)input0_end - (long)pfVar86; 0xf < lVar91; lVar91 = lVar91 + -0x10) {
    fVar11 = pfVar86[1];
    fVar12 = pfVar86[2];
    fVar13 = pfVar86[3];
    fVar14 = pfVar89[1];
    fVar15 = pfVar89[2];
    fVar16 = pfVar89[3];
    fVar17 = pfVar90[1];
    fVar18 = pfVar90[2];
    fVar19 = pfVar90[3];
    fVar20 = pfVar87[1];
    fVar21 = pfVar87[2];
    fVar22 = pfVar87[3];
    *outputp = *pfVar87 * fVar10 + *pfVar90 * fVar9 + *pfVar89 * fVar8 + *pfVar86 * fVar7 + *outputp
    ;
    outputp[1] = fVar20 * fVar10 + fVar17 * fVar9 + fVar14 * fVar8 + fVar11 * fVar7 + outputp[1];
    outputp[2] = fVar21 * fVar10 + fVar18 * fVar9 + fVar15 * fVar8 + fVar12 * fVar7 + outputp[2];
    outputp[3] = fVar22 * fVar10 + fVar19 * fVar9 + fVar16 * fVar8 + fVar13 * fVar7 + outputp[3];
    outputp = outputp + 4;
    pfVar86 = pfVar86 + 4;
    pfVar89 = pfVar89 + 4;
    pfVar90 = pfVar90 + 4;
    pfVar87 = pfVar87 + 4;
  }
  if (pfVar86 < input0_end) {
    lVar91 = 0;
    do {
      pfVar1 = (float *)((long)pfVar86 + lVar91);
      *(float *)((long)outputp + lVar91) =
           *(float *)((long)pfVar87 + lVar91) * fVar10 +
           *(float *)((long)pfVar90 + lVar91) * fVar9 +
           *(float *)((long)pfVar89 + lVar91) * fVar8 +
           *pfVar1 * fVar7 + *(float *)((long)outputp + lVar91);
      lVar91 = lVar91 + 4;
    } while (pfVar1 + 1 < input0_end);
  }
  return;
}

Assistant:

static void STBIR_chans( stbir__vertical_gather_with_,_coeffs)( float * outputp, float const * vertical_coefficients, float const ** inputs, float const * input0_end )
{
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = outputp;

  stbIF0( float const * input0 = inputs[0]; float c0s = vertical_coefficients[0]; )
  stbIF1( float const * input1 = inputs[1]; float c1s = vertical_coefficients[1]; )
  stbIF2( float const * input2 = inputs[2]; float c2s = vertical_coefficients[2]; )
  stbIF3( float const * input3 = inputs[3]; float c3s = vertical_coefficients[3]; )
  stbIF4( float const * input4 = inputs[4]; float c4s = vertical_coefficients[4]; )
  stbIF5( float const * input5 = inputs[5]; float c5s = vertical_coefficients[5]; )
  stbIF6( float const * input6 = inputs[6]; float c6s = vertical_coefficients[6]; )
  stbIF7( float const * input7 = inputs[7]; float c7s = vertical_coefficients[7]; )

#if ( STBIR__vertical_channels == 1 ) && !defined(STB_IMAGE_RESIZE_VERTICAL_CONTINUE)
  // check single channel one weight
  if ( ( c0s >= (1.0f-0.000001f) ) && ( c0s <= (1.0f+0.000001f) ) )
  {
    STBIR_MEMCPY( output, input0, (char*)input0_end - (char*)input0 );
    return;
  }
#endif

  #ifdef STBIR_SIMD
  {
    stbIF0(stbir__simdfX c0 = stbir__simdf_frepX( c0s ); )
    stbIF1(stbir__simdfX c1 = stbir__simdf_frepX( c1s ); )
    stbIF2(stbir__simdfX c2 = stbir__simdf_frepX( c2s ); )
    stbIF3(stbir__simdfX c3 = stbir__simdf_frepX( c3s ); )
    stbIF4(stbir__simdfX c4 = stbir__simdf_frepX( c4s ); )
    stbIF5(stbir__simdfX c5 = stbir__simdf_frepX( c5s ); )
    stbIF6(stbir__simdfX c6 = stbir__simdf_frepX( c6s ); )
    stbIF7(stbir__simdfX c7 = stbir__simdf_frepX( c7s ); )

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= (16*stbir__simdfX_float_count) )
    {
      stbir__simdfX o0, o1, o2, o3, r0, r1, r2, r3;
      STBIR_SIMD_NO_UNROLL(output);

      // prefetch four loop iterations ahead (doesn't affect much for small resizes, but helps with big ones)
      stbIF0( stbir__prefetch( input0 + (16*stbir__simdfX_float_count) ); )
      stbIF1( stbir__prefetch( input1 + (16*stbir__simdfX_float_count) ); )
      stbIF2( stbir__prefetch( input2 + (16*stbir__simdfX_float_count) ); )
      stbIF3( stbir__prefetch( input3 + (16*stbir__simdfX_float_count) ); )
      stbIF4( stbir__prefetch( input4 + (16*stbir__simdfX_float_count) ); )
      stbIF5( stbir__prefetch( input5 + (16*stbir__simdfX_float_count) ); )
      stbIF6( stbir__prefetch( input6 + (16*stbir__simdfX_float_count) ); )
      stbIF7( stbir__prefetch( input7 + (16*stbir__simdfX_float_count) ); )

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdfX_load( o0, output );      stbir__simdfX_load( o1, output+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( o3, output+(3*stbir__simdfX_float_count) );
              stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c0 );  stbir__simdfX_madd( o1, o1, r1, c0 );                         stbir__simdfX_madd( o2, o2, r2, c0 );                             stbir__simdfX_madd( o3, o3, r3, c0 ); )
      #else
      stbIF0( stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_mult( o0, r0, c0 );      stbir__simdfX_mult( o1, r1, c0 );                             stbir__simdfX_mult( o2, r2, c0 );                                 stbir__simdfX_mult( o3, r3, c0 );  )
      #endif

      stbIF1( stbir__simdfX_load( r0, input1 );      stbir__simdfX_load( r1, input1+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input1+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input1+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c1 );  stbir__simdfX_madd( o1, o1, r1, c1 );                         stbir__simdfX_madd( o2, o2, r2, c1 );                             stbir__simdfX_madd( o3, o3, r3, c1 ); )
      stbIF2( stbir__simdfX_load( r0, input2 );      stbir__simdfX_load( r1, input2+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input2+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input2+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c2 );  stbir__simdfX_madd( o1, o1, r1, c2 );                         stbir__simdfX_madd( o2, o2, r2, c2 );                             stbir__simdfX_madd( o3, o3, r3, c2 ); )
      stbIF3( stbir__simdfX_load( r0, input3 );      stbir__simdfX_load( r1, input3+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input3+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input3+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c3 );  stbir__simdfX_madd( o1, o1, r1, c3 );                         stbir__simdfX_madd( o2, o2, r2, c3 );                             stbir__simdfX_madd( o3, o3, r3, c3 ); )
      stbIF4( stbir__simdfX_load( r0, input4 );      stbir__simdfX_load( r1, input4+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input4+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input4+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c4 );  stbir__simdfX_madd( o1, o1, r1, c4 );                         stbir__simdfX_madd( o2, o2, r2, c4 );                             stbir__simdfX_madd( o3, o3, r3, c4 ); )
      stbIF5( stbir__simdfX_load( r0, input5 );      stbir__simdfX_load( r1, input5+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input5+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input5+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c5 );  stbir__simdfX_madd( o1, o1, r1, c5 );                         stbir__simdfX_madd( o2, o2, r2, c5 );                             stbir__simdfX_madd( o3, o3, r3, c5 ); )
      stbIF6( stbir__simdfX_load( r0, input6 );      stbir__simdfX_load( r1, input6+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input6+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input6+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c6 );  stbir__simdfX_madd( o1, o1, r1, c6 );                         stbir__simdfX_madd( o2, o2, r2, c6 );                             stbir__simdfX_madd( o3, o3, r3, c6 ); )
      stbIF7( stbir__simdfX_load( r0, input7 );      stbir__simdfX_load( r1, input7+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input7+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input7+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c7 );  stbir__simdfX_madd( o1, o1, r1, c7 );                         stbir__simdfX_madd( o2, o2, r2, c7 );                             stbir__simdfX_madd( o3, o3, r3, c7 ); )

      stbir__simdfX_store( output, o0 );             stbir__simdfX_store( output+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output+(2*stbir__simdfX_float_count), o2 );  stbir__simdfX_store( output+(3*stbir__simdfX_float_count), o3 );
      output += (4*stbir__simdfX_float_count);
      stbIF0( input0 += (4*stbir__simdfX_float_count); ) stbIF1( input1 += (4*stbir__simdfX_float_count); ) stbIF2( input2 += (4*stbir__simdfX_float_count); ) stbIF3( input3 += (4*stbir__simdfX_float_count); ) stbIF4( input4 += (4*stbir__simdfX_float_count); ) stbIF5( input5 += (4*stbir__simdfX_float_count); ) stbIF6( input6 += (4*stbir__simdfX_float_count); ) stbIF7( input7 += (4*stbir__simdfX_float_count); )
    }

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
    {
      stbir__simdf o0, r0;
      STBIR_SIMD_NO_UNROLL(output);

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdf_load( o0, output );   stbir__simdf_load( r0, input0 ); stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #else
      stbIF0( stbir__simdf_load( r0, input0 );  stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #endif
      stbIF1( stbir__simdf_load( r0, input1 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) ); )
      stbIF2( stbir__simdf_load( r0, input2 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) ); )
      stbIF3( stbir__simdf_load( r0, input3 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) ); )
      stbIF4( stbir__simdf_load( r0, input4 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) ); )
      stbIF5( stbir__simdf_load( r0, input5 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) ); )
      stbIF6( stbir__simdf_load( r0, input6 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) ); )
      stbIF7( stbir__simdf_load( r0, input7 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) ); )

      stbir__simdf_store( output, o0 );
      output += 4;
      stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
    }
  }
  #else
  STBIR_NO_UNROLL_LOOP_START
  while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
  {
    float o0, o1, o2, o3;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; o1 = output[1] + input0[1] * c0s; o2 = output[2] + input0[2] * c0s; o3 = output[3] + input0[3] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; o1  = input0[1] * c0s; o2  = input0[2] * c0s; o3  = input0[3] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; o1 += input1[1] * c1s; o2 += input1[2] * c1s; o3 += input1[3] * c1s; )
    stbIF2( o0 += input2[0] * c2s; o1 += input2[1] * c2s; o2 += input2[2] * c2s; o3 += input2[3] * c2s; )
    stbIF3( o0 += input3[0] * c3s; o1 += input3[1] * c3s; o2 += input3[2] * c3s; o3 += input3[3] * c3s; )
    stbIF4( o0 += input4[0] * c4s; o1 += input4[1] * c4s; o2 += input4[2] * c4s; o3 += input4[3] * c4s; )
    stbIF5( o0 += input5[0] * c5s; o1 += input5[1] * c5s; o2 += input5[2] * c5s; o3 += input5[3] * c5s; )
    stbIF6( o0 += input6[0] * c6s; o1 += input6[1] * c6s; o2 += input6[2] * c6s; o3 += input6[3] * c6s; )
    stbIF7( o0 += input7[0] * c7s; o1 += input7[1] * c7s; o2 += input7[2] * c7s; o3 += input7[3] * c7s; )
    output[0] = o0; output[1] = o1; output[2] = o2; output[3] = o3;
    output += 4;
    stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
  }
  #endif
  STBIR_NO_UNROLL_LOOP_START
  while ( input0 < input0_end )
  {
    float o0;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; )
    stbIF2( o0 += input2[0] * c2s; )
    stbIF3( o0 += input3[0] * c3s; )
    stbIF4( o0 += input4[0] * c4s; )
    stbIF5( o0 += input5[0] * c5s; )
    stbIF6( o0 += input6[0] * c6s; )
    stbIF7( o0 += input7[0] * c7s; )
    output[0] = o0;
    ++output;
    stbIF0( ++input0; ) stbIF1( ++input1; ) stbIF2( ++input2; ) stbIF3( ++input3; ) stbIF4( ++input4; ) stbIF5( ++input5; ) stbIF6( ++input6; ) stbIF7( ++input7; )
  }
}